

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void insch(Terminal *term,wchar_t n)

{
  pos p2;
  _Bool _Var1;
  int iVar2;
  termline *line;
  wchar_t wVar3;
  wchar_t local_44;
  pos local_40;
  pos okend;
  pos okstart;
  termline *ldata;
  pos eol;
  wchar_t j;
  wchar_t m;
  wchar_t dir;
  wchar_t n_local;
  Terminal *term_local;
  
  iVar2 = 1;
  local_44 = n;
  if (n < L'\0') {
    iVar2 = -1;
    local_44 = -n;
  }
  m = local_44;
  if (term->cols - (term->curs).x < local_44) {
    m = term->cols - (term->curs).x;
  }
  eol.x = (term->cols - (term->curs).x) - m;
  local_40.y = (term->curs).y;
  local_40.x = term->cols;
  _Var1 = poslt(term->curs,term->selend);
  if ((_Var1) && (p2.x = local_40.x, p2.y = local_40.y, _Var1 = poslt(term->selstart,p2), _Var1)) {
    okend = term->curs;
    if (iVar2 < 1) {
      okend.x = m + okend.x;
    }
    else {
      local_40.x = local_40.x - m;
    }
    _Var1 = posle(okend,term->selstart);
    if ((_Var1) && (_Var1 = posle(term->selend,local_40), _Var1)) {
      (term->selstart).x = iVar2 * m + (term->selstart).x;
      (term->selend).x = iVar2 * m + (term->selend).x;
      if ((term->selstart).x < (term->curs).x) {
        __assert_fail("term->selstart.x >= term->curs.x",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0xb7d,"void insch(Terminal *, int)");
      }
      if (term->cols <= (term->selstart).x) {
        __assert_fail("term->selstart.x < term->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0xb7e,"void insch(Terminal *, int)");
      }
      if ((term->selend).x <= (term->curs).x) {
        __assert_fail("term->selend.x > term->curs.x",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0xb7f,"void insch(Terminal *, int)");
      }
      if (term->cols < (term->selend).x) {
        __assert_fail("term->selend.x <= term->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0xb80,"void insch(Terminal *, int)");
      }
    }
    else {
      deselect(term);
    }
  }
  check_boundary(term,(term->curs).x,(term->curs).y);
  if (iVar2 < 0) {
    check_boundary(term,(term->curs).x + m,(term->curs).y);
  }
  line = lineptr(term,(term->curs).y,L'஋',L'\x01');
  check_trust_status(term,line);
  eol.y = eol.x;
  if (iVar2 < 0) {
    for (eol.y = L'\0'; eol.y < eol.x; eol.y = eol.y + L'\x01') {
      move_termchar(line,line->chars + (long)(term->curs).x + (long)eol.y,
                    line->chars + (long)(term->curs).x + (long)eol.y + (long)m);
    }
    while (m != L'\0') {
      copy_termchar(line,(term->curs).x + eol.x,&term->erase_char);
      eol.x = eol.x + L'\x01';
      m = m + L'\xffffffff';
    }
  }
  else {
    while (wVar3 = eol.y + L'\xffffffff', eol.y != L'\0') {
      move_termchar(line,line->chars + (long)(term->curs).x + (long)wVar3 + (long)m,
                    line->chars + (long)(term->curs).x + (long)wVar3);
      eol.y = wVar3;
    }
    while (m != L'\0') {
      copy_termchar(line,(term->curs).x + m + L'\xffffffff',&term->erase_char);
      m = m + L'\xffffffff';
    }
  }
  return;
}

Assistant:

static void insch(Terminal *term, int n)
{
    int dir = (n < 0 ? -1 : +1);
    int m, j;
    pos eol;
    termline *ldata;

    n = (n < 0 ? -n : n);
    if (n > term->cols - term->curs.x)
        n = term->cols - term->curs.x;
    m = term->cols - term->curs.x - n;

    /*
     * We must de-highlight the selection if it overlaps any part of
     * the region affected by this operation, i.e. the region from the
     * current cursor position to end-of-line, _unless_ the entirety
     * of the selection is going to be moved to the left or right by
     * this operation but otherwise unchanged, in which case we can
     * simply move the highlight with the text.
     */
    eol.y = term->curs.y;
    eol.x = term->cols;
    if (poslt(term->curs, term->selend) && poslt(term->selstart, eol)) {
        pos okstart = term->curs;
        pos okend = eol;
        if (dir > 0) {
            /* Insertion: n characters at EOL will be splatted. */
            okend.x -= n;
        } else {
            /* Deletion: n characters at cursor position will be splatted. */
            okstart.x += n;
        }
        if (posle(okstart, term->selstart) && posle(term->selend, okend)) {
            /* Selection is contained entirely in the interval
             * [okstart,okend), so we need only adjust the selection
             * bounds. */
            term->selstart.x += dir * n;
            term->selend.x += dir * n;
            assert(term->selstart.x >= term->curs.x);
            assert(term->selstart.x < term->cols);
            assert(term->selend.x > term->curs.x);
            assert(term->selend.x <= term->cols);
        } else {
            /* Selection is not wholly contained in that interval, so
             * we must unhighlight it. */
            deselect(term);
        }
    }

    check_boundary(term, term->curs.x, term->curs.y);
    if (dir < 0)
        check_boundary(term, term->curs.x + n, term->curs.y);
    ldata = scrlineptr(term->curs.y);
    check_trust_status(term, ldata);
    if (dir < 0) {
        for (j = 0; j < m; j++)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j,
                          ldata->chars + term->curs.x + j + n);
        while (n--)
            copy_termchar(ldata, term->curs.x + m++, &term->erase_char);
    } else {
        for (j = m; j-- ;)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j + n,
                          ldata->chars + term->curs.x + j);
        while (n--)
            copy_termchar(ldata, term->curs.x + n, &term->erase_char);
    }
}